

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cursor.c
# Opt level: O2

int coda_cursor_goto_root(coda_cursor_conflict *cursor)

{
  int iVar1;
  coda_type *pcVar2;
  long in_FS_OFFSET;
  
  if (((cursor == (coda_cursor_conflict *)0x0) || (cursor->n < 1)) ||
     (cursor->stack[cursor->n - 1].type == (coda_dynamic_type_struct *)0x0)) {
    coda_set_error(-100,"invalid cursor argument (%s:%u)",
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-cursor.c"
                   ,0x54a);
LAB_0010dcb1:
    iVar1 = -1;
  }
  else {
    cursor->n = 1;
    if ((cursor->stack[0].type)->backend == coda_backend_memory) {
      coda_mem_cursor_update_offset(cursor);
    }
    if (*(int *)(in_FS_OFFSET + -0x38) != 0) {
      pcVar2 = (coda_type *)cursor->stack[(long)cursor->n + -1].type;
      if (99 < pcVar2->format) {
        pcVar2 = *(coda_type **)&pcVar2->type_class;
      }
      if (pcVar2->type_class == 6) {
        iVar1 = coda_cursor_use_base_type_of_special_type(cursor);
        if (iVar1 != 0) goto LAB_0010dcb1;
      }
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

LIBCODA_API int coda_cursor_goto_root(coda_cursor *cursor)
{
    if (cursor == NULL || cursor->n <= 0 || cursor->stack[cursor->n - 1].type == NULL)
    {
        coda_set_error(CODA_ERROR_INVALID_ARGUMENT, "invalid cursor argument (%s:%u)", __FILE__, __LINE__);
        return -1;
    }

    cursor->n = 1;

    if (cursor->stack[cursor->n - 1].type->backend == coda_backend_memory)
    {
        coda_mem_cursor_update_offset(cursor);
    }

    if (coda_option_bypass_special_types &&
        coda_get_type_for_dynamic_type(cursor->stack[cursor->n - 1].type)->type_class == coda_special_class)
    {
        if (coda_cursor_use_base_type_of_special_type(cursor) != 0)
        {
            return -1;
        }
    }

    return 0;
}